

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialog::adjustPosition(QDialog *this,QWidget *w)

{
  QDialogPrivate *this_00;
  QWidgetData *pQVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QWidget *this_01;
  QPoint *pQVar5;
  QScreen *pQVar6;
  QWindow *pQVar7;
  undefined8 uVar8;
  int extraout_var;
  QMetaType QVar9;
  QPoint QVar10;
  int iVar11;
  int extraout_EDX;
  int extraout_var_00;
  int iVar12;
  int iVar13;
  QWidget *pQVar14;
  int iVar15;
  anon_union_24_3_e3d07ef4_for_data *paVar16;
  undefined1 *puVar17;
  long in_FS_OFFSET;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  QPoint p;
  QPoint local_70;
  QMetaType local_68;
  QPoint local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_58,QGuiApplicationPrivate::platform_theme,0x12);
    cVar2 = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (cVar2 != '\0') goto LAB_004e2231;
  }
  local_70.xp.m_i = 0;
  local_70.yp.m_i = 0;
  if (w == (QWidget *)0x0) {
    pQVar5 = (QPoint *)QDialogPrivate::transientParentWindow(this_00);
    this_01 = (QWidget *)0x0;
  }
  else {
    this_01 = QWidget::window(w);
    pQVar5 = (QPoint *)0x0;
  }
  pQVar14 = this_01;
  if (this_01 == (QWidget *)0x0) {
    if (pQVar5 == (QPoint *)0x0) {
      QGuiApplication::primaryScreen();
      QScreen::virtualSiblings();
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,8,0x10);
        }
      }
      pQVar14 = &this->super_QWidget;
      if ((ulong)local_58._16_8_ < 2) goto LAB_004e1d95;
      local_58.shared = (PrivateShared *)QCursor::pos();
      pQVar6 = (QScreen *)QGuiApplication::screenAt((QPoint *)&local_58.shared);
    }
    else {
      pQVar6 = (QScreen *)QWindow::screen();
    }
  }
  else {
LAB_004e1d95:
    pQVar6 = QWidget::screen(pQVar14);
  }
  if (pQVar6 == (QScreen *)0x0) {
    auVar20 = ZEXT816(0xffffffffffffffff) << 0x40;
  }
  else {
    auVar20 = QScreen::availableGeometry();
  }
  QApplication::topLevelWidgets();
  iVar11 = 0;
  iVar12 = 0;
  puVar17 = (undefined1 *)0x0;
  do {
    pQVar14 = *(QWidget **)(&DAT_aaaaaaaaaaaaaaaa + (long)puVar17 * 8);
    if ((pQVar14->data->widget_attributes & 0x8000) != 0) {
      iVar15 = (pQVar14->data->crect).x1.m_i;
      iVar3 = QWidget::x(pQVar14);
      iVar15 = iVar15 - iVar3;
      iVar3 = (pQVar14->data->crect).y1.m_i;
      iVar4 = QWidget::y(pQVar14);
      iVar3 = iVar3 - iVar4;
      if (iVar12 <= iVar15) {
        iVar12 = iVar15;
      }
      if (iVar11 <= iVar3) {
        iVar11 = iVar3;
      }
    }
    bVar18 = iVar12 != 0;
    bVar19 = iVar11 != 0;
  } while ((!bVar19 || !bVar18) && (puVar17 = puVar17 + 1, puVar17 < &DAT_aaaaaaaaaaaaaaaa));
  iVar15 = 0x28;
  if ((iVar11 < 0x28 && iVar12 < 10) && (bVar19 && bVar18)) {
    iVar15 = iVar11;
  }
  iVar3 = 10;
  if ((iVar11 < 0x28 && iVar12 < 10) && (bVar19 && bVar18)) {
    iVar3 = iVar12;
  }
  iVar11 = auVar20._0_4_;
  iVar12 = auVar20._4_4_;
  if (this_01 == (QWidget *)0x0) {
    if (pQVar5 == (QPoint *)0x0) {
      iVar4 = auVar20._8_4_ - iVar11;
      local_70.xp.m_i = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + iVar11;
      iVar4 = auVar20._12_4_ - iVar12;
      local_70.yp.m_i = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + iVar12;
    }
    else {
      local_58.shared = (PrivateShared *)0x0;
      uVar8 = QWindow::mapToGlobal(pQVar5);
      iVar4 = QWindow::geometry();
      QWindow::geometry();
      local_70.yp.m_i =
           (((extraout_var_00 - extraout_var) - ((extraout_var_00 - extraout_var) + 1 >> 0x1f)) + 1
           >> 1) + (int)((ulong)uVar8 >> 0x20);
      local_70.xp.m_i =
           (((extraout_EDX - iVar4) - ((extraout_EDX - iVar4) + 1 >> 0x1f)) + 1 >> 1) + (int)uVar8;
    }
  }
  else {
    pQVar7 = QWidget::windowHandle(this_01);
    if (pQVar7 == (QWindow *)0x0) {
      bVar18 = false;
    }
    else {
      QWidget::windowHandle(this_01);
      paVar16 = &local_58;
      QObject::property((char *)paVar16->data);
      local_60 = (QPoint)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType;
      local_68.d_ptr = (QMetaTypeInterface *)(CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc);
      bVar18 = comparesEqual(&local_68,(QMetaType *)&local_60);
      if (bVar18) {
        uVar8 = local_58.shared;
        if ((local_40 & 1) != 0) {
          uVar8 = *(QMetaTypeInterface **)
                   (local_58.shared +
                   (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)(local_58.shared + 4));
        }
      }
      else {
        local_68.d_ptr = (QMetaTypeInterface *)0x0;
        QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((local_40 & 1) != 0) {
          paVar16 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_58.shared +
                    (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)(local_58.shared + 4));
        }
        QMetaType::convert(QVar9,paVar16,(QMetaType)local_60,&local_68);
        uVar8 = local_68.d_ptr;
      }
      bVar18 = (QMetaTypeInterface *)uVar8 != (QMetaTypeInterface *)0x0;
    }
    if (pQVar7 != (QWindow *)0x0) {
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    if (bVar18) {
      QVar10 = QWidget::pos(this_01);
    }
    else {
      local_60.xp.m_i = 0;
      local_60.yp.m_i = 0;
      QVar10 = QWidget::mapToGlobal(this_01,&local_60);
    }
    pQVar1 = this_01->data;
    iVar4 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    iVar13 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    local_70.yp.m_i = ((iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1) + QVar10.yp.m_i.m_i;
    local_70.xp.m_i = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + QVar10.xp.m_i.m_i;
  }
  pQVar1 = (this->super_QWidget).data;
  iVar4 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  local_70.xp.m_i = (local_70.xp.m_i - iVar3) - ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1);
  iVar13 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  local_70.yp.m_i = (local_70.yp.m_i - iVar15) - ((iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1);
  iVar13 = auVar20._8_4_ + 1;
  if (iVar13 < iVar4 + iVar3 + 1 + local_70.xp.m_i) {
    local_70.xp.m_i = iVar13 - (iVar3 + iVar4 + 1);
  }
  if (local_70.xp.m_i < iVar11) {
    local_70.xp.m_i = iVar11;
  }
  iVar11 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  iVar3 = auVar20._12_4_ + 1;
  if (iVar3 < iVar11 + local_70.yp.m_i + iVar15 + 1) {
    local_70.yp.m_i = iVar3 - (iVar15 + iVar11 + 1);
  }
  if (local_70.yp.m_i < iVar12) {
    local_70.yp.m_i = iVar12;
  }
  if ((pQVar6 != (QScreen *)0x0) &&
     (pQVar7 = QWidget::windowHandle(&this->super_QWidget), pQVar7 != (QWindow *)0x0)) {
    QWindow::setScreen((QScreen *)pQVar7);
  }
  QWidget::move(&this->super_QWidget,&local_70);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,8,0x10);
  }
LAB_004e2231:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::adjustPosition(QWidget* w)
{
    Q_D(QDialog);

    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
        if (theme->themeHint(QPlatformTheme::WindowAutoPlacement).toBool())
            return;
    QPoint p(0, 0);
    int extraw = 0, extrah = 0;
    const QWindow *parentWindow = nullptr;
    if (w) {
        w = w->window();
    } else {
        parentWindow = d->transientParentWindow();
    }
    QRect desk;
    QScreen *scrn = nullptr;
    if (w)
        scrn = w->screen();
    else if (parentWindow)
        scrn = parentWindow->screen();
    else if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        scrn = QGuiApplication::screenAt(QCursor::pos());
    else
        scrn = screen();
    if (scrn)
        desk = scrn->availableGeometry();

    QWidgetList list = QApplication::topLevelWidgets();
    for (int i = 0; (extraw == 0 || extrah == 0) && i < list.size(); ++i) {
        QWidget * current = list.at(i);
        if (current->isVisible()) {
            int framew = current->geometry().x() - current->x();
            int frameh = current->geometry().y() - current->y();

            extraw = qMax(extraw, framew);
            extrah = qMax(extrah, frameh);
        }
    }

    // sanity check for decoration frames. With embedding, we
    // might get extraordinary values
    if (extraw == 0 || extrah == 0 || extraw >= 10 || extrah >= 40) {
        extrah = 40;
        extraw = 10;
    }


    if (w) {
        // Use pos() if the widget is embedded into a native window
        QPoint pp;
        if (w->windowHandle() && qvariant_cast<WId>(w->windowHandle()->property("_q_embedded_native_parent_handle")))
            pp = w->pos();
        else
            pp = w->mapToGlobal(QPoint(0,0));
        p = QPoint(pp.x() + w->width()/2,
                    pp.y() + w->height()/ 2);
    } else if (parentWindow) {
        // QTBUG-63406: Widget-based dialog in QML, which has no Widget parent
        // but a transient parent window.
        QPoint pp = parentWindow->mapToGlobal(QPoint(0, 0));
        p = QPoint(pp.x() + parentWindow->width() / 2, pp.y() + parentWindow->height() / 2);
    } else {
        // p = middle of the desktop
        p = QPoint(desk.x() + desk.width()/2, desk.y() + desk.height()/2);
    }

    // p = origin of this
    p = QPoint(p.x()-width()/2 - extraw,
                p.y()-height()/2 - extrah);


    if (p.x() + extraw + width() > desk.x() + desk.width())
        p.setX(desk.x() + desk.width() - width() - extraw);
    if (p.x() < desk.x())
        p.setX(desk.x());

    if (p.y() + extrah + height() > desk.y() + desk.height())
        p.setY(desk.y() + desk.height() - height() - extrah);
    if (p.y() < desk.y())
        p.setY(desk.y());

    // QTBUG-52735: Manually set the correct target screen since scaling in a
    // subsequent call to QWindow::resize() may otherwise use the wrong factor
    // if the screen changed notification is still in an event queue.
    if (scrn) {
        if (QWindow *window = windowHandle())
            window->setScreen(scrn);
    }

    move(p);
}